

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O3

bool __thiscall CTuningParams::Get(CTuningParams *this,char *pName,float *pValue)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = str_comp_nocase(pName,*(char **)((long)s_apNames + lVar2));
    if (iVar1 == 0) {
      *pValue = (float)(this->m_GroundControlSpeed).m_Value / 100.0;
      break;
    }
    this = (CTuningParams *)&this->m_GroundControlAccel;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x100);
  return iVar1 == 0;
}

Assistant:

bool CTuningParams::Get(const char *pName, float *pValue) const
{
	for(int i = 0; i < Num(); i++)
		if(str_comp_nocase(pName, GetName(i)) == 0)
			return Get(i, pValue);
	return false;
}